

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

void __thiscall
Json::Reader::addComment(Reader *this,Location begin,Location end,CommentPlacement placement)

{
  Value *this_00;
  char *local_28 [2];
  char local_18 [16];
  
  if (this->collectComments_ == false) {
    __assert_fail("collectComments_",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fishiu[P]mahjong/json/../jsoncpp.cpp"
                  ,0x21b,"void Json::Reader::addComment(Location, Location, CommentPlacement)");
  }
  if (placement == commentAfterOnSameLine) {
    this_00 = this->lastValue_;
    if (this_00 == (Value *)0x0) {
      __assert_fail("lastValue_ != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fishiu[P]mahjong/json/../jsoncpp.cpp"
                    ,0x21d,"void Json::Reader::addComment(Location, Location, CommentPlacement)");
    }
    local_28[0] = local_18;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_28);
    Value::setComment(this_00,local_28[0],commentAfterOnSameLine);
  }
  else {
    local_28[0] = local_18;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_28);
    std::__cxx11::string::append((string *)&this->commentsBefore_);
  }
  std::__cxx11::string::~string((string *)local_28);
  return;
}

Assistant:

void
Reader::addComment(Location begin, Location end, CommentPlacement placement) {
  assert(collectComments_);
  if (placement == commentAfterOnSameLine) {
    assert(lastValue_ != 0);
    lastValue_->setComment(std::string(begin, end), placement);
  } else {
    commentsBefore_ += std::string(begin, end);
  }
}